

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O0

void device_reset_ymf278b(void *info)

{
  int local_1c;
  int i;
  YMF278BChip *chip;
  void *info_local;
  
  (**(code **)((long)info + 0x660))(*(undefined8 *)((long)info + 0x650));
  *(undefined1 *)((long)info + 0x644) = 0;
  *(undefined4 *)((long)info + 0x500) = 0;
  *(undefined4 *)((long)info + 0x504) = 0;
  *(undefined1 *)((long)info + 0x508) = 0;
  for (local_1c = 0; local_1c < 0x18; local_1c = local_1c + 1) {
    ymf278b_slot_reset((YMF278BSlot *)((long)info + (long)local_1c * 0x34 + 0x20));
  }
  *(undefined1 *)((long)info + 0x546) = 0;
  for (local_1c = 0xff; -1 < local_1c; local_1c = local_1c + -1) {
    ymf278b_C_w((YMF278BChip *)info,(UINT8)local_1c,'\0');
  }
  *(undefined4 *)((long)info + 0x50c) = 0;
  *(undefined4 *)((long)info + 0x514) = 3;
  *(undefined4 *)((long)info + 0x510) = 3;
  *(undefined4 *)((long)info + 0x51c) = 0;
  *(undefined4 *)((long)info + 0x518) = 0;
  refresh_opl3_volume((YMF278BChip *)info);
  return;
}

Assistant:

static void device_reset_ymf278b(void *info)
{
	YMF278BChip* chip = (YMF278BChip *)info;
	int i;
	
	chip->fm.reset(chip->fm.chip);
	chip->exp = 0x00;
	
	chip->eg_cnt = 0;
	chip->tl_int_cnt = 0;
	chip->tl_int_step = 0;

	for (i = 0; i < 24; i ++)
		ymf278b_slot_reset(&chip->slots[i]);
	chip->regs[2] = 0; // avoid UMR
	for (i = 255; i >= 0; i --)	// reverse order to avoid UMR
		ymf278b_C_w(chip, i, 0);
	
	chip->memadr = 0;
	chip->fm_l = chip->fm_r = 3;
	chip->pcm_l = chip->pcm_r = 0;
	refresh_opl3_volume(chip);
}